

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O2

SharedSemaphore * myutils::SharedSemaphore::create(char *name)

{
  SharedSemaphore *this;
  sem_t *psVar1;
  
  this = (SharedSemaphore *)operator_new(0x28);
  SharedSemaphore(this);
  if (name == (char *)0x0) {
    sem_init((sem_t *)&this->m_unamed_sem,0,0);
    this->m_sem = &this->m_unamed_sem;
  }
  else {
    psVar1 = sem_open(name,0x40,0x1b6,0);
    this->m_sem = (sem_t *)psVar1;
    if (psVar1 == (sem_t *)0x0) {
      ~SharedSemaphore(this);
      operator_delete(this);
      this = (SharedSemaphore *)0x0;
    }
  }
  return this;
}

Assistant:

SharedSemaphore*  SharedSemaphore::create(const char* name)
{
#ifdef _WIN32
    HANDLE h = CreateSemaphoreA(NULL, 0, 1000000, name);
    if (h != nullptr) {
        auto sem = new SharedSemaphore();
        sem->m_hSemaphore = h;
        return sem;
    } else {
        return nullptr;
    }
#elif defined(__linux__)
    auto sem = new SharedSemaphore();
    if (name) {
        sem->m_sem = sem_open(name, O_CREAT, 0666, 0);
    }
    else {
        sem_init(&sem->m_unamed_sem, 0, 0);
        sem->m_sem = &sem->m_unamed_sem;
    }
    if (sem->m_sem != SEM_FAILED) {
        return sem;
    } else {
        delete sem;
        return nullptr;
    }
#else
    auto sem = new SharedSemaphore();

    sem->m_data = name ? (PthreadData*)name : &sem->m_data_not_shared;
    sem->m_data->count = 0;

    pthread_condattr_t cond_shared_attr;  
    pthread_condattr_init (&cond_shared_attr);  
    pthread_condattr_setpshared (&cond_shared_attr, PTHREAD_PROCESS_SHARED);
    pthread_cond_init (&sem->m_data->cond, &cond_shared_attr);  

    pthread_mutexattr_t mutex_shared_attr;  
    pthread_mutexattr_init (&mutex_shared_attr);  
    pthread_mutexattr_setpshared (&mutex_shared_attr, PTHREAD_PROCESS_SHARED);
    pthread_mutex_init (&sem->m_data->mtx, &mutex_shared_attr);

    return sem;
#endif
}